

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseSession.cpp
# Opt level: O2

void __thiscall
tonk::ApplicationSession::onP2PStartConnect
          (ApplicationSession *this,uint16_t myRendezvousVisibleSourcePort,
          uint32_t rendezvousServerConnectionId,P2PConnectParams *startParams)

{
  atomic<int> *paVar1;
  key_t key;
  OutputWorker *pOVar2;
  IConnection *pIVar3;
  Connection *this_00;
  uint uVar4;
  uint64_t value;
  char *pcVar5;
  ushort uVar6;
  bool bVar7;
  Result result;
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [8];
  string local_1d8;
  undefined1 local_1b8 [16];
  RefCounter *local_1a8;
  ConnectionIdMap *local_1a0;
  ConnectionAddrMap *local_198;
  ConnectionIdMap *local_190;
  __shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2> local_188;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  FloodDetector *local_168;
  data_union adStack_160 [10];
  
  if (((this->SelfRefCount).Shutdown._M_base._M_i & 1U) == 0) {
    key = (key_t)(startParams->EncryptionKey >> 0x20);
    if (startParams->WinTies != false) {
      key = (key_t)startParams->EncryptionKey;
    }
    pIVar3 = P2PConnectionKeyMap::FindByKey(&this->P2PKeyMap,key);
    if (pIVar3 != (IConnection *)0x0) {
      if ((int)(this->Logger).ChannelMinLevel < 4) {
        local_1b8._0_8_ = (this->Logger).ChannelName;
        local_1b8._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<((ostream *)&local_1a8,(string *)&(this->Logger).Prefix);
        std::operator<<((ostream *)&local_1a8,
                        "Ignoring simultaneous P2P connect request with the same incoming probe key"
                       );
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      }
      LOCK();
      paVar1 = &(pIVar3->SelfRefCount).RefCount;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
      UNLOCK();
      return;
    }
    if (this->P2PSocketsInitialized == false) {
      initializeP2PSockets(this,startParams);
    }
    bVar7 = (startParams->PeerExternalAddress).impl_.data_.base.sa_family != 2;
    if (bVar7) {
      local_1f8._8_8_ = *(undefined8 *)((long)&(startParams->PeerExternalAddress).impl_.data_ + 8);
      local_1f8._16_8_ =
           *(undefined8 *)((long)&(startParams->PeerExternalAddress).impl_.data_ + 0x10);
      local_1e0 = (undefined1  [8])
                  (ulong)(startParams->PeerExternalAddress).impl_.data_.v6.sin6_scope_id;
      local_1f8._4_4_ = 0;
    }
    else {
      local_1f8._4_4_ = (startParams->PeerExternalAddress).impl_.data_.v4.sin_addr.s_addr;
      local_1e0 = (undefined1  [8])0x0;
      local_1f8._8_8_ = 0;
      local_1f8._16_8_ = 0;
    }
    local_1f8._0_4_ = ZEXT14(bVar7);
    asio::ip::address::to_string_abi_cxx11_((string *)&result,(address *)local_1f8);
    uVar6 = swap_bytes((startParams->PeerExternalAddress).impl_.data_.v4.sin_port);
    uVar4 = (uint)(startParams->EncryptionKey >> 0x20);
    if (startParams->WinTies != false) {
      uVar4 = (uint)startParams->EncryptionKey;
    }
    HexString_abi_cxx11_((string *)(local_1e0 + 8),(tonk *)(ulong)uVar4,value);
    if ((int)(this->Logger).ChannelMinLevel < 3) {
      local_1b8._0_8_ = (this->Logger).ChannelName;
      local_1b8._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,(string *)&(this->Logger).Prefix);
      std::operator<<((ostream *)&local_1a8,"Server requesting that we P2P connect to ");
      std::operator<<((ostream *)&local_1a8,(string *)&result);
      std::operator<<((ostream *)&local_1a8,":");
      std::ostream::operator<<((ostream *)&local_1a8,uVar6);
      std::operator<<((ostream *)&local_1a8," - WinTies=");
      pcVar5 = "false";
      if (startParams->WinTies != false) {
        pcVar5 = "true";
      }
      std::operator<<((ostream *)&local_1a8,pcVar5);
      std::operator<<((ostream *)&local_1a8," Interval=");
      std::ostream::operator<<((ostream *)&local_1a8,startParams->ProtocolRoundIntervalMsec);
      std::operator<<((ostream *)&local_1a8,". Waiting for probe key = ");
      std::operator<<((ostream *)&local_1a8,(string *)(local_1e0 + 8));
      std::operator<<((ostream *)&local_1a8,". Requesting ports from ");
      std::ostream::operator<<((ostream *)&local_1a8,myRendezvousVisibleSourcePort);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
    std::__cxx11::string::~string((string *)(local_1e0 + 8));
    std::__cxx11::string::~string((string *)&result);
    this_00 = (Connection *)operator_new(0xc930,(nothrow_t *)&std::nothrow);
    if (this_00 != (Connection *)0x0) {
      Connection::Connection(this_00);
      local_1b8._0_8_ = &this->SelfRefCount;
      local_1b8._8_8_ = &this->MainSocket;
      local_1a8 = (RefCounter *)&(this->MainSocket).AddressMap;
      local_1a0 = &this->IdMap;
      local_190 = (ConnectionIdMap *)
                  (this->MappedPort).
                  super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      local_198 = (ConnectionAddrMap *)&this->P2PKeyMap;
      std::__shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_188,
                 &(this->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>);
      local_178 = (element_type *)0x0;
      adStack_160[0]._8_4_ = 0;
      local_168 = (FloodDetector *)0x0;
      adStack_160[0]._0_8_ = 0;
      local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
      adStack_160[0]._16_8_ = this;
      Connection::InitializeP2PConnection
                ((Connection *)&result,(Dependencies *)this_00,(TonkSocketConfig *)local_1b8,
                 (int)this + 0x3800,(P2PConnectParams *)(ulong)rendezvousServerConnectionId);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
      if (result.Error != (ErrorResult *)0x0) {
        (*(this_00->super_IConnection)._vptr_IConnection[1])(this_00);
      }
      Result::~Result(&result);
      return;
    }
    if (4 < (int)(this->Logger).ChannelMinLevel) {
      return;
    }
    local_1b8._0_8_ = (this->Logger).ChannelName;
    local_1b8._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,(string *)&(this->Logger).Prefix);
    std::operator<<((ostream *)&local_1a8,"OOM during new P2P connection");
    pOVar2 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b8);
  }
  else {
    if (3 < (int)(this->Logger).ChannelMinLevel) {
      return;
    }
    local_1b8._0_8_ = (this->Logger).ChannelName;
    local_1b8._8_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,(string *)&(this->Logger).Prefix);
    std::operator<<((ostream *)&local_1a8,"P2P connection aborted during shutdown");
    pOVar2 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void ApplicationSession::onP2PStartConnect(
    uint16_t myRendezvousVisibleSourcePort,
    uint32_t rendezvousServerConnectionId,
    const protocol::P2PConnectParams& startParams)
{
    if (SelfRefCount.IsShutdown())
    {
        Logger.Warning("P2P connection aborted during shutdown");
        return;
    }

    // Attempt to find a duplicate connection request
    IConnection* icon = P2PKeyMap.FindByKey(startParams.GetExpectedIncomingProbeKey());
    if (icon)
    {
        Logger.Warning("Ignoring simultaneous P2P connect request with the same incoming probe key");
        icon->SelfRefCount.DecrementReferences();
        return;
    }

    // Note that this function is called from the Asio green thread,
    // so the P2P sockets will only be initialized once
    if (!P2PSocketsInitialized) {
        initializeP2PSockets(startParams);
    }

    Logger.Info("Server requesting that we P2P connect to ",
        startParams.PeerExternalAddress.address().to_string(), ":", startParams.PeerExternalAddress.port(),
        " - WinTies=", startParams.WinTies, " Interval=",
        startParams.ProtocolRoundIntervalMsec, ". Waiting for probe key = ",
        HexString(startParams.GetExpectedIncomingProbeKey()),
        ". Requesting ports from ", myRendezvousVisibleSourcePort);

    Connection* connection = new(std::nothrow) Connection;

    if (!connection)
    {
        Logger.Error("OOM during new P2P connection");
        return;
    }

    Result result = connection->InitializeP2PConnection({
        &SelfRefCount,
        &MainSocket,
        &MainSocket.AddressMap,
        &IdMap,
        &P2PKeyMap,
        MappedPort.get(),
        Context,
        nullptr, // No FloodDetector backref for P2P connections
        UDPAddress(), // No Disconnect addr key
        this
    },
        &Config,
        rendezvousServerConnectionId,
        startParams);

    if (result.IsFail())
    {
        // Result already logged in InitializeP2PConnection()
        delete connection;
        connection = nullptr;
    }
}